

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5Init(sqlite3 *db)

{
  int iVar1;
  undefined8 *pAux;
  long lVar2;
  undefined **ppuVar3;
  ulong uVar4;
  void *p;
  undefined8 *puVar5;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  byte bVar7;
  BuiltinTokenizer aBuiltin [3];
  undefined8 local_88;
  undefined1 local_80 [88];
  long local_28;
  
  bVar7 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    pAux = (undefined8 *)sqlite3Malloc(0x70);
  }
  else {
    pAux = (undefined8 *)0x0;
  }
  if (pAux == (undefined8 *)0x0) {
    iVar1 = 7;
  }
  else {
    pAux[6] = 0;
    pAux[7] = 0;
    *pAux = 0;
    pAux[1] = 0;
    pAux[2] = 0;
    pAux[3] = 0;
    pAux[4] = 0;
    pAux[5] = 0;
    pAux[0xc] = 0;
    pAux[0xd] = 0;
    pAux[10] = 0;
    pAux[0xb] = 0;
    pAux[8] = 0;
    pAux[9] = 0;
    pAux[6] = db;
    *(undefined4 *)pAux = 3;
    pAux[3] = fts5CreateAux;
    pAux[1] = fts5CreateTokenizer;
    pAux[2] = fts5FindTokenizer;
    pAux[4] = fts5CreateTokenizer_v2;
    pAux[5] = fts5FindTokenizer_v2;
    sqlite3_randomness(0x10,pAux + 0xc);
    *(uint *)(pAux + 0xc) = *(uint *)(pAux + 0xc) ^ 0xf924976d;
    *(uint *)((long)pAux + 100) = *(uint *)((long)pAux + 100) ^ 0x16596e13;
    *(uint *)(pAux + 0xd) = *(uint *)(pAux + 0xd) ^ 0x7c80beaa;
    *(uint *)((long)pAux + 0x6c) = *(uint *)((long)pAux + 0x6c) ^ 0x9b03a67f;
    iVar1 = createModule(db,"fts5",(sqlite3_module *)fts5Init_fts5Mod,pAux,fts5ModuleDestroy);
    if (iVar1 == 0) {
      puVar5 = &DAT_0023f2c8;
      uVar4 = 0;
      do {
        iVar1 = (*(code *)pAux[3])(pAux,puVar5[-3],puVar5[-2],puVar5[-1]);
        if (2 < uVar4) break;
        uVar4 = uVar4 + 1;
        puVar5 = puVar5 + 4;
      } while (iVar1 == 0);
    }
    if (iVar1 == 0) {
      ppuVar3 = &PTR_anon_var_dwarf_89cff_0023f330;
      puVar5 = &local_88;
      for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *ppuVar3;
        ppuVar3 = ppuVar3 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      puVar6 = local_80;
      uVar4 = 0;
      do {
        iVar1 = (*(code *)pAux[1])(pAux,*(undefined8 *)(puVar6 + -8),pAux,puVar6);
        if (1 < uVar4) break;
        uVar4 = uVar4 + 1;
        puVar6 = puVar6 + 0x20;
      } while (iVar1 == 0);
      if (iVar1 == 0) {
        iVar1 = (*(code *)pAux[4])(pAux,"porter",pAux);
      }
    }
    if (iVar1 == 0) {
      iVar1 = createModule(db,"fts5vocab",(sqlite3_module *)sqlite3Fts5VocabInit_fts5Vocab,pAux,
                           (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5",1,1,pAux,fts5Fts5Func,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5_source_id",0,0x200801,pAux,fts5SourceIdFunc,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5_locale",2,0x1300001,pAux,fts5LocaleFunc,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
    if (iVar1 == 0) {
      iVar1 = createFunctionApi(db,"fts5_insttoken",1,0x1200001,pAux,fts5InsttokenFunc,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts5Init(sqlite3 *db){
  return fts5Init(db);
}